

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::TEST_CompactRange(DBImpl *this,int level,Slice *begin,Slice *end)

{
  bool bVar1;
  bool local_f1;
  MutexLock local_e8;
  MutexLock l;
  InternalKey local_c0;
  undefined1 local_a0 [8];
  ManualCompaction manual;
  InternalKey end_storage;
  InternalKey begin_storage;
  Slice *end_local;
  Slice *begin_local;
  int level_local;
  DBImpl *this_local;
  
  if (level < 0) {
    __assert_fail("level >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                  ,0x254,
                  "void leveldb::DBImpl::TEST_CompactRange(int, const Slice *, const Slice *)");
  }
  if (6 < level + 1) {
    __assert_fail("level + 1 < config::kNumLevels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                  ,0x255,
                  "void leveldb::DBImpl::TEST_CompactRange(int, const Slice *, const Slice *)");
  }
  InternalKey::InternalKey((InternalKey *)&end_storage.field_0x18);
  InternalKey::InternalKey((InternalKey *)&manual.tmp_storage.field_0x18);
  ManualCompaction::ManualCompaction((ManualCompaction *)local_a0);
  local_a0[4] = false;
  local_a0._0_4_ = level;
  if (begin == (Slice *)0x0) {
    manual.level = 0;
    manual.done = false;
    manual._5_3_ = 0;
  }
  else {
    InternalKey::InternalKey(&local_c0,begin,0xffffffffffffff,kTypeValue);
    InternalKey::operator=((InternalKey *)&end_storage.field_0x18,&local_c0);
    InternalKey::~InternalKey(&local_c0);
    manual._0_8_ = &end_storage.field_0x18;
  }
  if (end == (Slice *)0x0) {
    manual.begin = (InternalKey *)0x0;
  }
  else {
    InternalKey::InternalKey((InternalKey *)&l,end,0,kTypeDeletion);
    InternalKey::operator=((InternalKey *)&manual.tmp_storage.field_0x18,(InternalKey *)&l);
    InternalKey::~InternalKey((InternalKey *)&l);
    manual.begin = (InternalKey *)&manual.tmp_storage.field_0x18;
  }
  MutexLock::MutexLock(&local_e8,&this->mutex_);
  while( true ) {
    local_f1 = false;
    if ((local_a0[4] & 1U) == 0) {
      bVar1 = std::atomic<bool>::load(&this->shutting_down_,memory_order_acquire);
      local_f1 = false;
      if (!bVar1) {
        local_f1 = Status::ok(&this->bg_error_);
      }
    }
    if (local_f1 == false) break;
    if (this->manual_compaction_ == (ManualCompaction *)0x0) {
      this->manual_compaction_ = (ManualCompaction *)local_a0;
      MaybeScheduleCompaction(this);
    }
    else {
      port::CondVar::Wait(&this->background_work_finished_signal_);
    }
  }
  if (this->manual_compaction_ == (ManualCompaction *)local_a0) {
    this->manual_compaction_ = (ManualCompaction *)0x0;
  }
  MutexLock::~MutexLock(&local_e8);
  ManualCompaction::~ManualCompaction((ManualCompaction *)local_a0);
  InternalKey::~InternalKey((InternalKey *)&manual.tmp_storage.field_0x18);
  InternalKey::~InternalKey((InternalKey *)&end_storage.field_0x18);
  return;
}

Assistant:

void DBImpl::TEST_CompactRange(int level, const Slice* begin,
                               const Slice* end) {
  assert(level >= 0);
  assert(level + 1 < config::kNumLevels);

  InternalKey begin_storage, end_storage;

  ManualCompaction manual;
  manual.level = level;
  manual.done = false;
  if (begin == nullptr) {
    manual.begin = nullptr;
  } else {
    begin_storage = InternalKey(*begin, kMaxSequenceNumber, kValueTypeForSeek);
    manual.begin = &begin_storage;
  }
  if (end == nullptr) {
    manual.end = nullptr;
  } else {
    end_storage = InternalKey(*end, 0, static_cast<ValueType>(0));
    manual.end = &end_storage;
  }

  MutexLock l(&mutex_);
  while (!manual.done && !shutting_down_.load(std::memory_order_acquire) &&
         bg_error_.ok()) {
    if (manual_compaction_ == nullptr) {  // Idle
      manual_compaction_ = &manual;
      MaybeScheduleCompaction();
    } else {  // Running either my compaction or another compaction.
      background_work_finished_signal_.Wait();
    }
  }
  if (manual_compaction_ == &manual) {
    // Cancel my manual compaction since we aborted early for some reason.
    manual_compaction_ = nullptr;
  }
}